

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O3

int __thiscall ncnn::DeformableConv2D_x86::create_pipeline(DeformableConv2D_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  long *plVar6;
  Allocator *pAVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Mat *pMVar13;
  uint _h;
  Layer *pLVar14;
  int *piVar15;
  uint _h_00;
  int _elempack;
  ulong uVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  long lVar19;
  int k;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  undefined4 *puVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  undefined4 *puVar29;
  ParamDict pd_5;
  ParamDict pd;
  ParamDict local_170;
  DeformableConv2D_x86 *local_160;
  Option *local_158;
  ulong local_150;
  Mat local_148;
  void *local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  int local_e8;
  Allocator *local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  int local_c8;
  size_t local_c0;
  ulong local_b8;
  undefined4 *local_b0;
  ModelBinFromMatArray local_a8;
  Mat local_98;
  undefined4 *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  switch((this->super_DeformableConv2D).activation_type) {
  case 1:
    pLVar14 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_148);
    break;
  case 2:
    pLVar14 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_148);
    break;
  case 3:
    pLVar14 = create_layer_cpu(0x36);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    ParamDict::set((ParamDict *)&local_148,1,
                   *(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4));
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_148);
    break;
  case 4:
    pLVar14 = create_layer_cpu(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_148);
    break;
  case 5:
    pLVar14 = create_layer_cpu(0x47);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_148);
    break;
  case 6:
    pLVar14 = create_layer_cpu(0x43);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    ParamDict::set((ParamDict *)&local_148,1,
                   *(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4));
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_148);
    break;
  default:
    pLVar14 = (Layer *)0x0;
    goto LAB_0055d70d;
  }
  ParamDict::~ParamDict((ParamDict *)&local_148);
  (*pLVar14->_vptr_Layer[4])(pLVar14,opt);
LAB_0055d70d:
  this->activation = pLVar14;
  iVar1 = (this->super_DeformableConv2D).kernel_w;
  lVar26 = (long)iVar1;
  iVar2 = (this->super_DeformableConv2D).kernel_h;
  _h_00 = iVar2 * iVar1;
  uVar3 = (this->super_DeformableConv2D).num_output;
  local_b8 = (ulong)uVar3;
  uVar16 = (long)(this->super_DeformableConv2D).weight_data_size / (long)(int)_h_00;
  uVar16 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
  uVar21 = (long)uVar16 / (long)(int)uVar3;
  _h = (uint)uVar21;
  iVar25 = 1;
  uVar28 = 1;
  if (opt->use_packing_layout == true) {
    uVar28 = (uint)((uVar21 & 3) == 0) * 3 + 1;
    iVar25 = (uint)((uVar3 & 3) == 0) * 3 + 1;
  }
  if (opt->use_sgemm_convolution == true) {
    pLVar14 = create_layer_cpu(0x4a);
    this->gemm = pLVar14;
    ParamDict::ParamDict(&local_170);
    ParamDict::set(&local_170,2,0);
    ParamDict::set(&local_170,3,0);
    ParamDict::set(&local_170,4,1);
    ParamDict::set(&local_170,5,0);
    ParamDict::set(&local_170,6,1);
    ParamDict::set(&local_170,7,(this->super_DeformableConv2D).num_output);
    ParamDict::set(&local_170,8,0);
    ParamDict::set(&local_170,9,_h * _h_00);
    ParamDict::set(&local_170,10,-(uint)((this->super_DeformableConv2D).bias_term == 0) | 1);
    ParamDict::set(&local_170,0xb,1);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_170);
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.allocator = (Allocator *)0x0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    Mat::reshape(&local_148,&(this->super_DeformableConv2D).weight_data,_h_00,_h,
                 (this->super_DeformableConv2D).num_output,(Allocator *)0x0);
    local_158 = opt;
    Mat::create(&local_98,_h * _h_00,(this->super_DeformableConv2D).num_output,4,(Allocator *)0x0);
    opt = local_158;
    lVar26 = (long)(this->super_DeformableConv2D).num_output;
    if (0 < lVar26) {
      local_150 = (long)local_98.w * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
      ;
      uVar16 = (ulong)uVar28;
      lVar22 = 0;
      do {
        if ((int)uVar28 <= (int)_h) {
          lVar24 = (long)local_148.w *
                   CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
          puVar17 = (undefined4 *)
                    (CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) *
                     local_148.cstep * lVar22 + (long)local_148.data);
          puVar23 = (undefined4 *)(local_150 * lVar22 + (long)local_98.data);
          lVar27 = 0;
          do {
            if (0 < (int)_h_00) {
              uVar20 = 0;
              uVar21 = uVar16;
              puVar29 = puVar17;
              puVar18 = puVar17;
              do {
                do {
                  *puVar23 = *puVar29;
                  puVar23 = puVar23 + 1;
                  uVar21 = uVar21 - 1;
                  puVar29 = (undefined4 *)((long)puVar29 + lVar24);
                } while (uVar21 != 0);
                uVar20 = uVar20 + 1;
                puVar29 = puVar18 + 1;
                uVar21 = uVar16;
                puVar18 = puVar29;
              } while (uVar20 != _h_00);
            }
            lVar27 = lVar27 + uVar16;
            puVar17 = (undefined4 *)((long)puVar17 + lVar24 * uVar16);
          } while (lVar27 < (long)((long)(int)_h - (ulong)(uVar28 - 1)));
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != lVar26);
    }
    piVar15 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    local_160 = this;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if (local_148.data != (void *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->super_DeformableConv2D).bias_term == 0) {
      piVar15 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      local_148.data = local_98.data;
      local_148.refcount._0_4_ = local_98.refcount._0_4_;
      local_148.refcount._4_4_ = local_98.refcount._4_4_;
      local_148.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_148.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_148.elempack = local_98.elempack;
      local_148.allocator = local_98.allocator;
      local_148.dims = local_98.dims;
      local_148.w = local_98.w;
      local_148.h = local_98.h;
      local_148.d = local_98.d;
      local_148.c = local_98.c;
      local_148.cstep = local_98.cstep;
      pLVar14 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_148);
      (*pLVar14->_vptr_Layer[3])(pLVar14,&local_a8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      piVar15 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            if (local_148.data != (void *)0x0) {
              free(local_148.data);
            }
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      piVar15 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      local_c0 = 0;
      local_c8 = 0;
      uStack_cc = 0;
      uStack_d0 = 0;
      uStack_d4 = 0;
      uStack_d8 = 0;
      local_e0 = (Allocator *)0x0;
      local_e8 = 0;
      uStack_ec = 0;
      local_f0 = 0;
      uStack_f4 = 0;
      uStack_f8 = 0;
      local_100 = (void *)0x0;
      if ((Mat *)&local_100 != &(this->super_DeformableConv2D).bias_data) {
        piVar15 = (this->super_DeformableConv2D).bias_data.refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + 1;
          UNLOCK();
        }
        local_100 = (this->super_DeformableConv2D).bias_data.data;
        piVar15 = (this->super_DeformableConv2D).bias_data.refcount;
        uStack_f8 = SUB84(piVar15,0);
        uStack_f4 = (undefined4)((ulong)piVar15 >> 0x20);
        sVar4 = (this->super_DeformableConv2D).bias_data.elemsize;
        local_f0 = (undefined4)sVar4;
        uStack_ec = (undefined4)(sVar4 >> 0x20);
        local_e8 = (this->super_DeformableConv2D).bias_data.elempack;
        local_e0 = (this->super_DeformableConv2D).bias_data.allocator;
        uVar9 = (this->super_DeformableConv2D).bias_data.dims;
        uVar10 = (this->super_DeformableConv2D).bias_data.w;
        uVar11 = (this->super_DeformableConv2D).bias_data.h;
        uVar12 = (this->super_DeformableConv2D).bias_data.d;
        local_c8 = (this->super_DeformableConv2D).bias_data.c;
        local_c0 = (this->super_DeformableConv2D).bias_data.cstep;
        uStack_d8 = uVar9;
        uStack_d4 = uVar10;
        uStack_d0 = uVar11;
        uStack_cc = uVar12;
      }
      local_148.cstep = local_98.cstep;
      local_148.c = local_98.c;
      local_148.d = local_98.d;
      local_148.h = local_98.h;
      local_148.w = local_98.w;
      local_148.dims = local_98.dims;
      local_148.allocator = local_98.allocator;
      local_148.elempack = local_98.elempack;
      local_148.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_148.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_148.refcount._4_4_ = local_98.refcount._4_4_;
      local_148.refcount._0_4_ = local_98.refcount._0_4_;
      local_148.data = local_98.data;
      pLVar14 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_148);
      (*pLVar14->_vptr_Layer[3])(pLVar14,&local_a8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      lVar26 = 0x48;
      do {
        piVar15 = *(int **)((long)&local_148.refcount + lVar26);
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            pvVar5 = *(void **)((long)&local_148.data + lVar26);
            plVar6 = *(long **)((long)&local_148.allocator + lVar26);
            if (plVar6 == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_148.cstep + lVar26) = 0;
        *(undefined8 *)((long)&local_148.refcount + lVar26 + 4) = 0;
        *(undefined8 *)((long)&local_148.elemsize + lVar26 + 4) = 0;
        *(undefined8 *)((long)&local_148.data + lVar26) = 0;
        *(undefined8 *)((long)&local_148.refcount + lVar26) = 0;
        *(undefined8 *)((long)&local_148.dims + lVar26) = 0;
        *(undefined8 *)((long)&local_148.h + lVar26) = 0;
        *(undefined4 *)((long)&local_148.c + lVar26) = 0;
        lVar26 = lVar26 + -0x48;
        opt = local_158;
      } while (lVar26 != -0x48);
    }
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar15 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if (local_98.data != (void *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&local_170);
  }
  else if ((iVar25 == 1) && (uVar28 == 1)) {
    piVar15 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + 1;
      UNLOCK();
    }
    piVar15 = (this->weight_data_tm).refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        pvVar5 = (this->weight_data_tm).data;
        pAVar7 = (this->weight_data_tm).allocator;
        if (pAVar7 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)uVar16 % (long)(int)uVar3 & 0xffffffff);
        }
      }
    }
    piVar15 = (this->super_DeformableConv2D).weight_data.refcount;
    (this->weight_data_tm).data = (this->super_DeformableConv2D).weight_data.data;
    (this->weight_data_tm).refcount = piVar15;
    (this->weight_data_tm).elemsize = (this->super_DeformableConv2D).weight_data.elemsize;
    (this->weight_data_tm).elempack = (this->super_DeformableConv2D).weight_data.elempack;
    (this->weight_data_tm).allocator = (this->super_DeformableConv2D).weight_data.allocator;
    iVar1 = (this->super_DeformableConv2D).weight_data.w;
    iVar2 = (this->super_DeformableConv2D).weight_data.h;
    iVar25 = (this->super_DeformableConv2D).weight_data.d;
    (this->weight_data_tm).dims = (this->super_DeformableConv2D).weight_data.dims;
    (this->weight_data_tm).w = iVar1;
    (this->weight_data_tm).h = iVar2;
    (this->weight_data_tm).d = iVar25;
    (this->weight_data_tm).c = (this->super_DeformableConv2D).weight_data.c;
    (this->weight_data_tm).cstep = (this->super_DeformableConv2D).weight_data.cstep;
  }
  else {
    local_48 = &this->weight_data_tm;
    local_50 = (undefined4 *)(this->super_DeformableConv2D).weight_data.data;
    _elempack = uVar28 * iVar25;
    local_160 = this;
    local_158 = opt;
    Mat::create(local_48,(int)(_h * _h_00 * uVar3) / _elempack,(ulong)(uint)(_elempack * 4),
                _elempack,(Allocator *)0x0);
    pMVar13 = local_48;
    if (0 < (int)uVar3) {
      pvVar5 = (local_160->weight_data_tm).data;
      lVar24 = iVar2 * lVar26;
      lVar22 = (int)_h * lVar24;
      local_40 = lVar22 * 4;
      local_38 = lVar26 * 4;
      local_150 = 0;
      do {
        if (0 < iVar2) {
          local_b0 = local_50;
          lVar27 = 0;
          do {
            if (0 < iVar1) {
              lVar19 = 0;
              puVar17 = local_b0;
              do {
                if (0 < (int)_h) {
                  uVar16 = (ulong)(uint)((int)local_150 >> 0x1f) << 0x20 | local_150 & 0xffffffff;
                  uVar20 = 0;
                  puVar23 = puVar17;
                  do {
                    uVar8 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
                    *(undefined4 *)
                     ((long)pvVar5 +
                     (long)(int)((((int)((long)uVar8 / (long)(int)uVar28) +
                                  ((int)lVar19 +
                                  ((int)((long)uVar16 / (long)iVar25) * iVar2 + (int)lVar27) * iVar1
                                  ) * (_h / uVar28)) * uVar28 +
                                 (int)((long)uVar8 % (long)(int)uVar28)) * iVar25 +
                                (int)((long)uVar16 % (long)iVar25)) * 4) = *puVar23;
                    uVar20 = uVar20 + 1;
                    puVar23 = puVar23 + lVar24;
                  } while ((uVar21 & 0xffffffff) != uVar20);
                }
                lVar19 = lVar19 + 1;
                puVar17 = puVar17 + 1;
              } while (lVar19 != lVar26);
            }
            lVar27 = lVar27 + 1;
            local_b0 = local_b0 + lVar26;
          } while (lVar27 != iVar2);
        }
        local_150 = local_150 + 1;
        local_50 = local_50 + lVar22;
      } while (local_150 != local_b8);
    }
    Mat::reshape(&local_148,local_48,(int)_h / (int)uVar28,_h_00,
                 (int)((long)((ulong)(uint)((int)local_b8 >> 0x1f) << 0x20 | local_b8 & 0xffffffff)
                      / (long)iVar25),(Allocator *)0x0);
    opt = local_158;
    this = local_160;
    piVar15 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (&local_148 != pMVar13) {
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      piVar15 = (local_160->weight_data_tm).refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          pvVar5 = (local_160->weight_data_tm).data;
          pAVar7 = (local_160->weight_data_tm).allocator;
          if (pAVar7 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar7->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).data = local_148.data;
      piVar15 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      (this->weight_data_tm).refcount = piVar15;
      (this->weight_data_tm).elemsize =
           CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
      (this->weight_data_tm).elempack = local_148.elempack;
      (this->weight_data_tm).allocator = local_148.allocator;
      (this->weight_data_tm).dims = local_148.dims;
      (this->weight_data_tm).w = local_148.w;
      (this->weight_data_tm).h = local_148.h;
      (this->weight_data_tm).d = local_148.d;
      (this->weight_data_tm).c = local_148.c;
      (this->weight_data_tm).cstep = local_148.cstep;
    }
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if (local_148.data != (void *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    piVar15 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar15 != (int *)0x0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      if (*piVar15 == 0) {
        pvVar5 = (this->super_DeformableConv2D).weight_data.data;
        pAVar7 = (this->super_DeformableConv2D).weight_data.allocator;
        if (pAVar7 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar7->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeformableConv2D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.elemsize + 4) = 0;
    (this->super_DeformableConv2D).weight_data.data = (void *)0x0;
    (this->super_DeformableConv2D).weight_data.refcount = (int *)0x0;
    (this->super_DeformableConv2D).weight_data.dims = 0;
    (this->super_DeformableConv2D).weight_data.w = 0;
    (this->super_DeformableConv2D).weight_data.h = 0;
    (this->super_DeformableConv2D).weight_data.d = 0;
    (this->super_DeformableConv2D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}